

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

void __thiscall kj::anon_unknown_77::AsyncTee::ensurePulling(AsyncTee *this)

{
  Disposer *pDVar1;
  PromiseNode *pPVar2;
  bool bVar3;
  Promise<void> PVar4;
  UnwindDetector unwind;
  UnwindDetector local_24;
  undefined1 local_20 [8];
  undefined8 local_18;
  
  if (this->pulling == false) {
    this->pulling = true;
    UnwindDetector::UnwindDetector(&local_24);
    PVar4 = pull((AsyncTee *)local_20);
    pDVar1 = (this->pullPromise).super_PromiseBase.node.disposer;
    pPVar2 = (this->pullPromise).super_PromiseBase.node.ptr;
    (this->pullPromise).super_PromiseBase.node.disposer = (Disposer *)local_20;
    (this->pullPromise).super_PromiseBase.node.ptr = local_18;
    local_18._0_4_ = 0;
    local_18._4_4_ = 0;
    if (pPVar2 != (PromiseNode *)0x0) {
      (**pDVar1->_vptr_Disposer)
                (pDVar1,pPVar2->_vptr_PromiseNode[-2] + (long)&pPVar2->_vptr_PromiseNode,
                 PVar4.super_PromiseBase.node.ptr);
    }
    bVar3 = UnwindDetector::isUnwinding(&local_24);
    if (bVar3) {
      this->pulling = false;
    }
  }
  return;
}

Assistant:

void ensurePulling() {
    if (!pulling) {
      pulling = true;
      UnwindDetector unwind;
      KJ_DEFER(if (unwind.isUnwinding()) pulling = false);
      pullPromise = pull();
    }
  }